

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::_::
CopyConstructArray_<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  
  pbVar3 = this->start;
  pbVar4 = this->pos;
  if (pbVar3 < pbVar4) {
    do {
      this->pos = pbVar4 + -1;
      pcVar1 = pbVar4[-1]._M_dataplus._M_p;
      pbVar2 = pbVar4 + -1;
      pbVar4 = pbVar4 + -1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &pbVar2->field_2) {
        operator_delete(pcVar1,(pbVar2->field_2)._M_allocated_capacity + 1);
        pbVar3 = this->start;
        pbVar4 = this->pos;
      }
    } while (pbVar3 < pbVar4);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }